

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O2

double randn(RandnState *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  bool bVar8;
  
  uVar2 = state->g_randn_x << 0xb ^ state->g_randn_x;
  uVar1 = state->g_randn_w;
  uVar3 = uVar2 >> 8 ^ uVar1 >> 0x13 ^ uVar2 ^ uVar1;
  uVar5 = uVar3 >> 4;
  iVar7 = 0xb;
  uVar6 = state->g_randn_y;
  uVar2 = state->g_randn_z;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    uVar4 = uVar6 << 0xb ^ uVar6;
    uVar4 = uVar4 >> 8 ^ uVar3 >> 0x13 ^ uVar4 ^ uVar3;
    uVar5 = uVar5 + (uVar4 >> 4);
    uVar6 = uVar2;
    uVar2 = uVar1;
    uVar1 = uVar3;
    uVar3 = uVar4;
  }
  state->g_randn_x = uVar6;
  state->g_randn_y = uVar2;
  state->g_randn_z = uVar1;
  state->g_randn_w = uVar3;
  return (double)uVar5 * 3.725290298461914e-09 + -6.0;
}

Assistant:

double randn(RandnState *state) {
  uint32_t t;
  t = state->g_randn_x ^ (state->g_randn_x << 11);
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w
    = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));

  uint32_t tmp = state->g_randn_w >> 4;
  for (int i = 0; i < 11; ++i) {
    t = state->g_randn_x ^ (state->g_randn_x << 11);
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w
      = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));
    tmp += state->g_randn_w >> 4;
  }
  return tmp / 268435456.0 - 6.0;
}